

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

floatx80 propagateFloatx80NaN_mips(floatx80 a,floatx80 b,float_status *status)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  floatx80 fVar6;
  
  uVar2 = b._8_4_;
  uVar3 = a._8_4_;
  bVar1 = 2;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (uVar3 & 0x7fff) == 0x7fff) {
    if (status->snan_bit_is_one == '\0') {
      bVar5 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0
              && ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0;
    }
    else {
      bVar5 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0;
    }
    bVar1 = (uVar3 & 0x7fff) == 0x7fff & bVar5 | 4;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (uVar2 & 0x7fff) != 0x7fff) {
    bVar5 = false;
  }
  else {
    if (status->snan_bit_is_one == '\0') {
      bVar5 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0
              && ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0;
    }
    else {
      bVar5 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0;
    }
    bVar5 = (bool)(bVar5 & (uVar2 & 0x7fff) == 0x7fff);
  }
  if ((bVar1 == 5) || (bVar5)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode == '\0') {
    if (bVar1 == 5) {
      if (status->snan_bit_is_one != '\0') {
LAB_00716e5d:
        __assert_fail("!snan_bit_is_one(status)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                      ,0x33f,"floatx80 floatx80_silence_nan_mips(floatx80, float_status *)");
      }
      uVar4 = a.low | 0xc000000000000000;
    }
    else {
      uVar4 = a.low;
      if ((bool)(bVar1 != 4 | bVar5)) {
        uVar3 = uVar2;
        uVar4 = b.low;
      }
      if (bVar5) {
        if (status->snan_bit_is_one != '\0') goto LAB_00716e5d;
        uVar4 = b.low | 0xc000000000000000;
        uVar3 = uVar2;
      }
    }
  }
  else {
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips(float_status *)");
    }
    uVar4 = 0xc000000000000000;
    uVar3 = (uint)CONCAT62(b._10_6_,0xffff);
  }
  fVar6._8_4_ = uVar3;
  fVar6.low = uVar4;
  fVar6._12_4_ = 0;
  return fVar6;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}